

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogLikelihoodsSecondDerivByPartition
          (BeagleCPUImpl<float,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *firstDerivativeIndices,int *secondDerivativeIndices,
          int *categoryWeightsIndices,int *stateFrequenciesIndices,int *cumulativeScaleIndices,
          int *partitionIndices,int partitionCount,double *outSumLogLikelihoodByPartition,
          double *outSumFirstDerivativeByPartition,double *outSumSecondDerivativeByPartition)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  float **ppfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  int *piVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  double *pdVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  ulong uVar34;
  int iVar35;
  uint uVar36;
  ulong uVar37;
  float *pfVar38;
  float *pfVar39;
  ulong uVar40;
  ulong uVar41;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar48;
  double dVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  double dVar57;
  undefined1 auVar58 [16];
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined8 in_XMM6_Qb;
  int *statesChild;
  
  if (0 < partitionCount) {
    uVar37 = 0;
    do {
      iVar4 = this->gPatternPartitionsStartPatterns[partitionIndices[uVar37]];
      lVar24 = (long)iVar4;
      iVar5 = this->gPatternPartitionsStartPatterns[(long)partitionIndices[uVar37] + 1];
      lVar30 = (long)iVar5;
      iVar25 = iVar5 - iVar4;
      memset(this->integrationTmp + this->kStateCount * iVar4,0,
             (long)(this->kStateCount * iVar25) << 2);
      memset(this->firstDerivTmp + this->kStateCount * iVar4,0,
             (long)(this->kStateCount * iVar25) << 2);
      memset(this->secondDerivTmp + this->kStateCount * iVar4,0,
             (long)(iVar25 * this->kStateCount) << 2);
      iVar25 = childBufferIndices[uVar37];
      iVar6 = cumulativeScaleIndices[uVar37];
      ppfVar11 = this->gTransitionMatrices;
      pfVar12 = ppfVar11[probabilityIndices[uVar37]];
      pfVar13 = ppfVar11[firstDerivativeIndices[uVar37]];
      pfVar14 = ppfVar11[secondDerivativeIndices[uVar37]];
      pfVar15 = this->gCategoryWeights[categoryWeightsIndices[uVar37]];
      pfVar16 = this->gStateFrequencies[stateFrequenciesIndices[uVar37]];
      pfVar17 = this->gPartials[parentBufferIndices[uVar37]];
      if ((iVar25 < this->kTipCount) && (piVar18 = this->gTipStates[iVar25], piVar18 != (int *)0x0))
      {
        iVar25 = this->kCategoryCount;
        if (0 < (long)iVar25) {
          iVar7 = this->kPartialsPaddedStateCount;
          uVar8 = this->kStateCount;
          iVar9 = this->kMatrixSize;
          iVar10 = this->kPatternCount;
          iVar27 = iVar7 * iVar4;
          lVar31 = 0;
          iVar35 = 0;
          do {
            if (iVar4 < iVar5) {
              fVar48 = pfVar15[lVar31];
              pfVar38 = this->integrationTmp;
              pfVar19 = this->firstDerivTmp;
              pfVar20 = this->secondDerivTmp;
              iVar33 = this->kTransPaddedStateCount;
              lVar28 = (long)iVar27;
              pfVar39 = pfVar17 + lVar28;
              lVar32 = lVar24;
              iVar29 = uVar8 * iVar4;
              do {
                if (0 < (int)uVar8) {
                  lVar26 = (long)piVar18[lVar32] + (long)iVar35;
                  uVar34 = 0;
                  do {
                    auVar43 = vfmadd213ss_fma(ZEXT416((uint)(pfVar12[lVar26] * pfVar39[uVar34])),
                                              ZEXT416((uint)fVar48),
                                              ZEXT416((uint)pfVar38[(long)iVar29 + uVar34]));
                    pfVar38[(long)iVar29 + uVar34] = auVar43._0_4_;
                    auVar43 = vfmadd213ss_fma(ZEXT416((uint)(pfVar13[lVar26] * pfVar39[uVar34])),
                                              ZEXT416((uint)fVar48),
                                              ZEXT416((uint)pfVar19[(long)iVar29 + uVar34]));
                    pfVar19[(long)iVar29 + uVar34] = auVar43._0_4_;
                    auVar43 = vfmadd213ss_fma(ZEXT416((uint)(pfVar14[lVar26] * pfVar39[uVar34])),
                                              ZEXT416((uint)fVar48),
                                              ZEXT416((uint)pfVar20[(long)iVar29 + uVar34]));
                    pfVar20[(long)iVar29 + uVar34] = auVar43._0_4_;
                    uVar34 = uVar34 + 1;
                    lVar26 = lVar26 + iVar33;
                  } while (uVar8 != uVar34);
                  iVar29 = iVar29 + (int)uVar34;
                }
                lVar28 = lVar28 + iVar7;
                iVar27 = (int)lVar28;
                lVar32 = lVar32 + 1;
                pfVar39 = pfVar39 + iVar7;
              } while (lVar32 != lVar30);
            }
            iVar27 = iVar27 + ((iVar4 - iVar5) + iVar10) * iVar7;
            lVar31 = lVar31 + 1;
            iVar35 = iVar35 + iVar9;
          } while (lVar31 != iVar25);
        }
      }
      else {
        iVar7 = this->kCategoryCount;
        if (0 < (long)iVar7) {
          pfVar39 = this->gPartials[iVar25];
          iVar25 = this->kPartialsPaddedStateCount;
          uVar8 = this->kStateCount;
          iVar9 = this->kMatrixSize;
          iVar10 = this->kPatternCount;
          uVar36 = iVar25 * iVar4;
          iVar27 = 0;
          lVar31 = 0;
          do {
            uVar34 = (ulong)uVar36;
            if (iVar4 < iVar5) {
              auVar43._0_8_ = (double)pfVar15[lVar31];
              auVar43._8_8_ = in_XMM6_Qb;
              pfVar19 = this->integrationTmp;
              pfVar20 = this->firstDerivTmp;
              pfVar21 = this->secondDerivTmp;
              uVar34 = (ulong)(int)uVar36;
              pfVar38 = pfVar39 + uVar34;
              uVar41 = (ulong)(uVar8 * iVar4);
              iVar35 = iVar4;
              do {
                if (0 < (int)uVar8) {
                  uVar41 = (ulong)(int)uVar41;
                  uVar40 = 0;
                  iVar33 = iVar27;
                  do {
                    dVar49 = 0.0;
                    uVar23 = 0;
                    dVar57 = 0.0;
                    dVar42 = 0.0;
                    do {
                      fVar48 = pfVar38[uVar23];
                      dVar42 = dVar42 + (double)(fVar48 * pfVar12[(long)iVar33 + uVar23]);
                      dVar57 = dVar57 + (double)(fVar48 * pfVar13[(long)iVar33 + uVar23]);
                      dVar49 = dVar49 + (double)(fVar48 * pfVar14[(long)iVar33 + uVar23]);
                      uVar23 = uVar23 + 1;
                    } while (uVar8 != uVar23);
                    auVar62._0_8_ = (double)pfVar19[uVar41];
                    auVar62._8_8_ = in_XMM6_Qb;
                    auVar60._8_8_ = 0;
                    auVar60._0_8_ = dVar42 * (double)pfVar17[uVar34 + uVar40];
                    auVar50 = vfmadd231sd_fma(auVar62,auVar43,auVar60);
                    pfVar19[uVar41] = (float)auVar50._0_8_;
                    auVar61._0_8_ = (double)pfVar20[uVar41];
                    auVar61._8_8_ = in_XMM6_Qb;
                    auVar51._8_8_ = 0;
                    auVar51._0_8_ = dVar57 * (double)pfVar17[uVar34 + uVar40];
                    auVar50 = vfmadd231sd_fma(auVar61,auVar43,auVar51);
                    pfVar20[uVar41] = (float)auVar50._0_8_;
                    auVar58._0_8_ = (double)pfVar21[uVar41];
                    auVar58._8_8_ = in_XMM6_Qb;
                    auVar50._8_8_ = 0;
                    auVar50._0_8_ = dVar49 * (double)pfVar17[uVar34 + uVar40];
                    auVar50 = vfmadd231sd_fma(auVar58,auVar43,auVar50);
                    pfVar21[uVar41] = (float)auVar50._0_8_;
                    uVar41 = uVar41 + 1;
                    uVar40 = uVar40 + 1;
                    iVar33 = iVar33 + uVar8 + 1;
                  } while (uVar40 != uVar8);
                }
                uVar34 = uVar34 + (long)iVar25;
                iVar35 = iVar35 + 1;
                pfVar38 = pfVar38 + iVar25;
              } while (iVar35 != iVar5);
            }
            uVar36 = (int)uVar34 + ((iVar4 - iVar5) + iVar10) * iVar25;
            lVar31 = lVar31 + 1;
            iVar27 = iVar27 + iVar9;
          } while (lVar31 != iVar7);
        }
      }
      if (iVar4 < iVar5) {
        iVar25 = this->kStateCount * iVar4;
        lVar31 = lVar24;
        do {
          iVar7 = this->kStateCount;
          if ((long)iVar7 < 1) {
            auVar43 = ZEXT816(0);
            fVar59 = 0.0;
            fVar48 = 0.0;
          }
          else {
            auVar51 = ZEXT816(0) << 0x40;
            lVar32 = 0;
            auVar50 = ZEXT816(0) << 0x40;
            auVar43 = ZEXT816(0);
            do {
              fVar48 = pfVar16[lVar32];
              auVar43 = vfmadd231ss_fma(auVar43,ZEXT416((uint)fVar48),
                                        ZEXT416((uint)this->integrationTmp[iVar25 + lVar32]));
              auVar50 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar48),
                                        ZEXT416((uint)this->firstDerivTmp[iVar25 + lVar32]));
              auVar51 = vfmadd231ss_fma(auVar51,ZEXT416((uint)fVar48),
                                        ZEXT416((uint)this->secondDerivTmp[iVar25 + lVar32]));
              lVar32 = lVar32 + 1;
            } while (iVar7 != lVar32);
            iVar25 = iVar25 + iVar7;
            fVar48 = auVar51._0_4_;
            fVar59 = auVar50._0_4_;
          }
          fVar56 = auVar43._0_4_;
          dVar42 = log((double)fVar56);
          this->outLogLikelihoodsTmp[lVar31] = (float)dVar42;
          auVar44._0_4_ = fVar59 / fVar56;
          auVar44._4_12_ = SUB6012((undefined1  [60])0x0,0);
          this->outFirstDerivativesTmp[lVar31] = auVar44._0_4_;
          auVar52._0_4_ = fVar48 / fVar56;
          auVar52._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar43 = vfnmadd231ss_fma(auVar52,auVar44,auVar44);
          this->outSecondDerivativesTmp[lVar31] = auVar43._0_4_;
          lVar31 = lVar31 + 1;
        } while (lVar31 != lVar30);
      }
      if ((iVar6 != -1) && (iVar4 < iVar5)) {
        pfVar12 = this->gScaleBuffers[iVar6];
        pfVar13 = this->outLogLikelihoodsTmp;
        lVar31 = lVar24;
        do {
          pfVar13[lVar31] = pfVar12[lVar31] + pfVar13[lVar31];
          lVar31 = lVar31 + 1;
        } while (lVar30 != lVar31);
      }
      outSumLogLikelihoodByPartition[uVar37] = 0.0;
      outSumFirstDerivativeByPartition[uVar37] = 0.0;
      outSumSecondDerivativeByPartition[uVar37] = 0.0;
      if (iVar4 < iVar5) {
        pdVar22 = this->gPatternWeights;
        pfVar12 = this->outLogLikelihoodsTmp;
        pfVar13 = this->outFirstDerivativesTmp;
        pfVar14 = this->outSecondDerivativesTmp;
        do {
          auVar45._0_8_ = (double)pfVar12[lVar24];
          auVar45._8_8_ = in_XMM6_Qb;
          auVar53._8_8_ = 0;
          auVar53._0_8_ = pdVar22[lVar24];
          auVar1._8_8_ = 0;
          auVar1._0_8_ = outSumLogLikelihoodByPartition[uVar37];
          auVar43 = vfmadd213sd_fma(auVar53,auVar45,auVar1);
          outSumLogLikelihoodByPartition[uVar37] = auVar43._0_8_;
          auVar46._0_8_ = (double)pfVar13[lVar24];
          auVar46._8_8_ = in_XMM6_Qb;
          auVar54._8_8_ = 0;
          auVar54._0_8_ = pdVar22[lVar24];
          auVar2._8_8_ = 0;
          auVar2._0_8_ = outSumFirstDerivativeByPartition[uVar37];
          auVar43 = vfmadd213sd_fma(auVar54,auVar46,auVar2);
          outSumFirstDerivativeByPartition[uVar37] = auVar43._0_8_;
          auVar47._0_8_ = (double)pfVar14[lVar24];
          auVar47._8_8_ = in_XMM6_Qb;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = pdVar22[lVar24];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = outSumSecondDerivativeByPartition[uVar37];
          auVar43 = vfmadd213sd_fma(auVar55,auVar47,auVar3);
          outSumSecondDerivativeByPartition[uVar37] = auVar43._0_8_;
          lVar24 = lVar24 + 1;
        } while (lVar30 != lVar24);
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 != (uint)partitionCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsSecondDerivByPartition(
                                                  const int* parentBufferIndices,
                                                  const int* childBufferIndices,
                                                  const int* probabilityIndices,
                                                  const int* firstDerivativeIndices,
                                                  const int* secondDerivativeIndices,
                                                  const int* categoryWeightsIndices,
                                                  const int* stateFrequenciesIndices,
                                                  const int* cumulativeScaleIndices,
                                                  const int* partitionIndices,
                                                  int partitionCount,
                                                  double* outSumLogLikelihoodByPartition,
                                                  double* outSumFirstDerivativeByPartition,
                                                  double* outSumSecondDerivativeByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&integrationTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));
        memset(&firstDerivTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));
        memset(&secondDerivTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int firstDerivativeIndex = firstDerivativeIndices[p];
        const int secondDerivativeIndex = secondDerivativeIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];
        const int stateFrequenciesIndex = stateFrequenciesIndices[p];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];

        assert(parIndex >= kTipCount);

        const REALTYPE* partialsParent = gPartials[parIndex];
        const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
        const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
        const REALTYPE* secondDerivMatrix = gTransitionMatrices[secondDerivativeIndex];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = startPattern * kPartialsPaddedStateCount; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        secondDerivTmp[u] += secondDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }

        } else { // Integrate against a partial at the child

            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = startPattern * kPartialsPaddedStateCount;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount;
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {
                    int w = l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJ = 0.0;
                        double sumOverJD1 = 0.0;
                        double sumOverJD2 = 0.0;
                        for(int j = 0; j < kStateCount; j++) {
                            sumOverJ += transMatrix[w] * partialsChild[v + j];
                            sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                            sumOverJD2 += secondDerivMatrix[w] * partialsChild[v + j];
                            w++;
                        }

                        // increment for the extra column at the end
                        w += T_PAD;

                        integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                        firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                        secondDerivTmp[u] += sumOverJD2 * partialsParent[v + i] * weight;
                        u++;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }
        }

        int u = startPattern * kStateCount;
        for(int k = startPattern; k < endPattern; k++) {
            REALTYPE sumOverI = 0.0;
            REALTYPE sumOverID1 = 0.0;
            REALTYPE sumOverID2 = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                sumOverID1 += freqs[i] * firstDerivTmp[u];
                sumOverID2 += freqs[i] * secondDerivTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sumOverI);
            outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
            outSecondDerivativesTmp[k] = sumOverID2 / sumOverI - outFirstDerivativesTmp[k] * outFirstDerivativesTmp[k];
        }


        if (scalingFactorsIndex != BEAGLE_OP_NONE) {
            const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
            for(int k=startPattern; k < endPattern; k++)
                outLogLikelihoodsTmp[k] += scalingFactors[k];
        }


        outSumLogLikelihoodByPartition[p] = 0.0;
        outSumFirstDerivativeByPartition[p] = 0.0;
        outSumSecondDerivativeByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p]    += outLogLikelihoodsTmp[i]    * gPatternWeights[i];
            outSumFirstDerivativeByPartition[p]  += outFirstDerivativesTmp[i]  * gPatternWeights[i];
            outSumSecondDerivativeByPartition[p] += outSecondDerivativesTmp[i] * gPatternWeights[i];
        }

    }
}